

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_xref.c
# Opt level: O0

nid_triple ** OBJ_bsearch_sigx(nid_triple **key,nid_triple **base,int num)

{
  nid_triple **ppnVar1;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  
  ppnVar1 = (nid_triple **)OBJ_bsearch_(in_RDI,in_RSI,in_EDX,8,sigx_cmp_BSEARCH_CMP_FN);
  return ppnVar1;
}

Assistant:

int OBJ_find_sigid_algs(int signid, int *pdig_nid, int *ppkey_nid)
{
    nid_triple tmp;
    const nid_triple *rv = NULL;
    tmp.sign_id = signid;

    if (sig_app != NULL) {
        int idx = sk_nid_triple_find(sig_app, &tmp);
        rv = sk_nid_triple_value(sig_app, idx);
    }
#ifndef OBJ_XREF_TEST2
    if (rv == NULL) {
        rv = OBJ_bsearch_sig(&tmp, sigoid_srt, OSSL_NELEM(sigoid_srt));
    }
#endif
    if (rv == NULL)
        return 0;
    if (pdig_nid)
        *pdig_nid = rv->hash_id;
    if (ppkey_nid)
        *ppkey_nid = rv->pkey_id;
    return 1;
}